

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void PIT_FloorDrop(AActor *thing,FChangePosition *cpos)

{
  double oldz;
  double dVar1;
  uint uVar2;
  player_t *ppVar3;
  double dVar4;
  double dVar5;
  
  oldz = (thing->__Pos).Z;
  dVar1 = thing->floorz;
  P_AdjustFloorCeil(thing,cpos);
  dVar4 = thing->floorz;
  if ((dVar1 == dVar4) && (!NAN(dVar1) && !NAN(dVar4))) {
    return;
  }
  if (((thing->flags4).Value & 0x80) != 0) {
    return;
  }
  dVar5 = (thing->Vel).Z;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    dVar5 = (thing->__Pos).Z;
LAB_0054388a:
    if (((dVar5 == dVar1) && (!NAN(dVar5) && !NAN(dVar1))) ||
       ((((thing->flags).Value & 0x20000200) != 0x200 || (-1 < (int)(thing->flags6).Value))))
    goto LAB_005438e7;
    dVar4 = (dVar4 - dVar1) + dVar5;
  }
  else {
    uVar2 = (thing->flags).Value;
    if ((uVar2 >> 9 & 1) == 0) {
      if ((-1 < (int)(thing->flags5).Value) &&
         ((((cpos->sector->Flags & 4) == 0 && (9.0 <= cpos->moveamt)) ||
          (cpos->moveamt < (thing->__Pos).Z - dVar4)))) goto LAB_005438e7;
    }
    else {
      dVar5 = (thing->__Pos).Z;
      if ((((uVar2 >> 0x1d & 1) != 0) || (dVar5 != dVar1)) || (NAN(dVar5) || NAN(dVar1)))
      goto LAB_0054388a;
    }
  }
  (thing->__Pos).Z = dVar4;
  P_CheckFakeFloorTriggers(thing,oldz,false);
  AActor::UpdateRenderSectorList(thing);
LAB_005438e7:
  ppVar3 = thing->player;
  if ((ppVar3 != (player_t *)0x0) && (ppVar3->mo == (APlayerPawn *)thing)) {
    ppVar3->viewz = ((thing->__Pos).Z - oldz) + ppVar3->viewz;
  }
  return;
}

Assistant:

void PIT_FloorDrop(AActor *thing, FChangePosition *cpos)
{
	double oldfloorz = thing->floorz;
	double oldz = thing->Z();

	P_AdjustFloorCeil(thing, cpos);

	if (oldfloorz == thing->floorz) return;
	if (thing->flags4 & MF4_ACTLIKEBRIDGE) return; // do not move bridge things

	if (thing->Vel.Z == 0 &&
		(!(thing->flags & MF_NOGRAVITY) ||
		(thing->Z() == oldfloorz && !(thing->flags & MF_NOLIFTDROP))))
	{
		if ((thing->flags & MF_NOGRAVITY) || (thing->flags5 & MF5_MOVEWITHSECTOR) ||
			(((cpos->sector->Flags & SECF_FLOORDROP) || cpos->moveamt < 9)
			&& thing->Z() - thing->floorz <= cpos->moveamt))
		{
			thing->SetZ(thing->floorz);
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
		}
	}
	else if ((thing->Z() != oldfloorz && !(thing->flags & MF_NOLIFTDROP)))
	{
		if ((thing->flags & MF_NOGRAVITY) && (thing->flags6 & MF6_RELATIVETOFLOOR))
		{
			thing->AddZ(-oldfloorz + thing->floorz);
			P_CheckFakeFloorTriggers(thing, oldz);
			thing->UpdateRenderSectorList();
		}
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}